

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

idx_t duckdb::GetCapacity(NType type)

{
  uint uVar1;
  InternalException *this;
  allocator local_59;
  string local_58;
  string local_38;
  
  uVar1 = type - 3;
  if (((byte)uVar1 < 8) && ((0xefU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(idx_t *)(&DAT_010636d8 + (ulong)(uVar1 & 0xff) * 8);
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Invalid node type for GetCapacity: %s.",&local_59);
  EnumUtil::ToString<duckdb::NType>(&local_58,type);
  InternalException::InternalException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t GetCapacity(NType type) {
	switch (type) {
	case NType::NODE_4:
		return Node4::CAPACITY;
	case NType::NODE_7_LEAF:
		return Node7Leaf::CAPACITY;
	case NType::NODE_15_LEAF:
		return Node15Leaf::CAPACITY;
	case NType::NODE_16:
		return Node16::CAPACITY;
	case NType::NODE_48:
		return Node48::CAPACITY;
	case NType::NODE_256_LEAF:
		return Node256::CAPACITY;
	case NType::NODE_256:
		return Node256::CAPACITY;
	default:
		throw InternalException("Invalid node type for GetCapacity: %s.", EnumUtil::ToString(type));
	}
}